

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::ConditionBinsSelectExpr::serializeTo
          (ConditionBinsSelectExpr *this,ASTSerializer *serializer)

{
  string_view name;
  bool bVar1;
  ASTSerializer *in_RSI;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RDI;
  Expression *item;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3;
  Symbol *in_stack_00000098;
  ASTSerializer *in_stack_000000a0;
  undefined1 in_stack_000000a8 [16];
  ASTSerializer *this_00;
  ASTSerializer *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  in_stack_ffffffffffffffc0;
  
  this_00 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffb0,
             (char *)in_RDI);
  ASTSerializer::writeLink(in_stack_000000a0,(string_view)in_stack_000000a8,in_stack_00000098);
  bVar1 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::empty
                    ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0x41397e);
  if (!bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffb0,
               (char *)in_RDI);
    name._M_str = (char *)in_stack_ffffffffffffffc0._M_current;
    name._M_len = in_stack_ffffffffffffffb8;
    ASTSerializer::startArray(in_stack_ffffffffffffffb0,name);
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
              ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RSI);
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end(in_RDI);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                          *)this_00,
                         (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                          *)in_RSI);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
      ::operator*((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                   *)&stack0xffffffffffffffc0);
      ASTSerializer::serialize(this_00,(Expression *)in_RSI);
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
      ::operator++((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                    *)&stack0xffffffffffffffc0);
    }
    ASTSerializer::endArray((ASTSerializer *)0x413a2d);
  }
  return;
}

Assistant:

void ConditionBinsSelectExpr::serializeTo(ASTSerializer& serializer) const {
    serializer.writeLink("target", target);
    if (!intersects.empty()) {
        serializer.startArray("intersects");
        for (auto item : intersects)
            serializer.serialize(*item);
        serializer.endArray();
    }
}